

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
          (cmGeneratorExpressionDAGChecker *this,cmListFileBacktrace *backtrace,string *target,
          string *property,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *parent)

{
  cmGeneratorExpressionDAGChecker *parent_local;
  GeneratorExpressionContent *content_local;
  string *property_local;
  string *target_local;
  cmListFileBacktrace *backtrace_local;
  cmGeneratorExpressionDAGChecker *this_local;
  
  this->Parent = parent;
  std::__cxx11::string::string((string *)&this->Target,(string *)target);
  std::__cxx11::string::string((string *)&this->Property,(string *)property);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->Seen);
  this->Content = content;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  this->TransitivePropertiesOnly = false;
  Initialize(this);
  return;
}

Assistant:

cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker(
  const cmListFileBacktrace& backtrace, const std::string& target,
  const std::string& property, const GeneratorExpressionContent* content,
  cmGeneratorExpressionDAGChecker* parent)
  : Parent(parent)
  , Target(target)
  , Property(property)
  , Content(content)
  , Backtrace(backtrace)
  , TransitivePropertiesOnly(false)
{
  Initialize();
}